

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O3

bool __thiscall
chatra::TemporaryObject::findConstructorCall
          (TemporaryObject *this,Reference sourceRef,Class *cl,StringId subName)

{
  Method *method;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_48;
  
  local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  method = MethodTable::find(&cl->constructors,(Class *)0x0,Init,subName,&this->args,&local_48);
  if (local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (method != (Method *)0x0) {
    setConstructorCall(this,sourceRef,cl,&cl->constructors,method);
    resolveNativeMethod(this,Init,method->subName);
  }
  return method != (Method *)0x0;
}

Assistant:

bool TemporaryObject::findConstructorCall(Reference sourceRef, const Class* cl, StringId subName) {
	chatra_assert(hasArgs);
	auto& table = cl->refConstructors();
	auto* constructor = table.find(nullptr, StringId::Init, subName, args, {});
	if (constructor == nullptr)
		return false;
	setConstructorCall(sourceRef, cl, &table, constructor);
	resolveNativeMethod(StringId::Init, constructor->subName);
	return true;
}